

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O0

void fft_convolve(fft_window_data *data,void *user)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  float *__src;
  long lVar5;
  long lVar6;
  int iVar7;
  uint local_4c;
  uint32_t buf_idx;
  uint32_t i;
  float *buf;
  float *fir;
  float *fft_workspace;
  uint32_t block_count;
  uint32_t block_idx;
  uint32_t block_size;
  uint32_t framesize;
  convolution_segment_data *user_data;
  void *user_local;
  fft_window_data *data_local;
  
  uVar4 = data->framesize;
  iVar7 = (int)uVar4;
  iVar1 = *(int *)((long)user + 0x6c);
  iVar2 = *(int *)((long)user + 0x70);
  uVar3 = *(uint *)((long)user + 0x68);
  __src = data->fft_workspace;
  lVar5 = *(long *)((long)user + 0x78);
  lVar6 = *(long *)((long)user + 0x80);
  memcpy((void *)(lVar6 + (ulong)(uint)(iVar2 * iVar7) * 4),__src,(uVar4 & 0xffffffff) << 2);
  *(uint *)((long)user + 0x70) = (iVar2 + 1U) % uVar3;
  memset(__src,0,(uVar4 & 0xffffffff) << 2);
  for (local_4c = 0; local_4c < uVar3; local_4c = local_4c + 1) {
    complex_multiply_add_resolver
              (__src,lVar6 + (ulong)((((iVar2 + uVar3) - local_4c) % uVar3) * iVar7) * 4,
               lVar5 + (ulong)(local_4c * iVar1) * 4,iVar7);
  }
  return;
}

Assistant:

VECTORIZE void fft_convolve(struct fft_window_data *data, void *user){
  struct convolution_segment_data *user_data = (struct convolution_segment_data *)user;
  uint32_t framesize = data->framesize;
  uint32_t block_size = user_data->block_size;
  uint32_t block_idx = user_data->block_idx;
  uint32_t block_count = user_data->block_count;
  float *fft_workspace = data->fft_workspace;
  float *fir = user_data->fir;
  float *buf = user_data->buf;

  // Preserve the current block
  memcpy(buf + (block_idx * framesize), fft_workspace, sizeof(float)*framesize);
  user_data->block_idx = (block_idx+1) % block_count;
  
  // Actually perform the FIR multiplication of each block in the delay line.
  memset(fft_workspace, 0, sizeof(float)*framesize);
  for(uint32_t i = 0; i < block_count; ++i){
    uint32_t buf_idx = (block_idx+block_count-i) % block_count;
    complex_multiply_add(fft_workspace, buf + (buf_idx * framesize), fir + (i * block_size), framesize);
  }
}